

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

overlap_iterator * __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::operator++
          (overlap_iterator *this)

{
  pointer pEVar1;
  size_type sVar2;
  uint32_t uVar3;
  
  pEVar1 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar2 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar3 = pEVar1[sVar2 - 1].offset + 1;
  if (((this->super_iterator).super_const_iterator.map)->height == 0) {
    uVar3 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true>_>
            ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_5U,_true>_>
                                *)pEVar1[sVar2 - 1].node,uVar3,pEVar1[sVar2 - 1].size,
                               &this->searchKey);
  }
  else {
    uVar3 = IntervalMapDetails::
            NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false>_>
            ::findFirstOverlap((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::Expression_*,_8U,_false>_>
                                *)pEVar1[sVar2 - 1].node,uVar3,pEVar1[sVar2 - 1].size,
                               &this->searchKey);
  }
  pEVar1 = (this->super_iterator).super_const_iterator.path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar2 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  pEVar1[sVar2 - 1].offset = uVar3;
  if ((uVar3 == pEVar1[sVar2 - 1].size) &&
     (((this->super_iterator).super_const_iterator.map)->height != 0)) {
    nextOverlap(this);
  }
  return this;
}

Assistant:

overlap_iterator& operator++() {
        SLANG_ASSERT(valid());

        uint32_t offset = this->path.leafOffset() + 1;
        auto size = this->path.leafSize();
        offset = this->isFlat()
                     ? this->path.template leaf<RootLeaf>().findFirstOverlap(offset, size,
                                                                             searchKey)
                     : this->path.template leaf<Leaf>().findFirstOverlap(offset, size, searchKey);

        this->path.leafOffset() = offset;
        if (offset == this->path.leafSize() && !this->isFlat())
            nextOverlap();

        return *this;
    }